

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int allocno_info_compare_func(void *a1,void *a2)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long diff;
  reg_info_t *reg_infos;
  MIR_reg_t reg2;
  MIR_reg_t reg1;
  allocno_info_t *allocno_info2;
  allocno_info_t *allocno_info1;
  void *a2_local;
  void *a1_local;
  
  uVar1 = *a1;
  uVar2 = *a2;
  lVar3 = *(long *)((long)a1 + 8);
  if (lVar3 != *(long *)((long)a2 + 8)) {
    __assert_fail("reg_infos == allocno_info2->reg_infos",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1c74,"int allocno_info_compare_func(const void *, const void *)");
  }
  if (*(int *)((long)a1 + 4) == 0) {
    if (*(int *)((long)a2 + 4) != 0) {
      return 1;
    }
  }
  else if (*(int *)((long)a2 + 4) != 0) {
    return -1;
  }
  lVar4 = *(long *)(lVar3 + (ulong)uVar2 * 0x10) - *(long *)(lVar3 + (ulong)uVar1 * 0x10);
  if (lVar4 == 0) {
    if (*(ulong *)(lVar3 + (ulong)uVar2 * 0x10 + 8) < *(ulong *)(lVar3 + (ulong)uVar1 * 0x10 + 8)) {
      a1_local._4_4_ = -1;
    }
    else if (*(ulong *)(lVar3 + (ulong)uVar1 * 0x10 + 8) <
             *(ulong *)(lVar3 + (ulong)uVar2 * 0x10 + 8)) {
      a1_local._4_4_ = 1;
    }
    else {
      a1_local._4_4_ = 1;
      if (uVar1 < uVar2) {
        a1_local._4_4_ = -1;
      }
    }
  }
  else {
    a1_local._4_4_ = (int)lVar4;
  }
  return a1_local._4_4_;
}

Assistant:

static int allocno_info_compare_func (const void *a1, const void *a2) {
  const allocno_info_t *allocno_info1 = (const allocno_info_t *) a1,
                       *allocno_info2 = (const allocno_info_t *) a2;
  MIR_reg_t reg1 = allocno_info1->reg, reg2 = allocno_info2->reg;
  reg_info_t *reg_infos = allocno_info1->reg_infos;
  long diff;

  gen_assert (reg_infos == allocno_info2->reg_infos);
  if (allocno_info1->tied_reg_p) {
    if (allocno_info2->tied_reg_p) return -1;
  } else if (allocno_info2->tied_reg_p) {
    return 1;
  }
  if ((diff = reg_infos[reg2].freq - reg_infos[reg1].freq) != 0) return diff;
  if (reg_infos[reg2].live_length < reg_infos[reg1].live_length) return -1;
  if (reg_infos[reg1].live_length < reg_infos[reg2].live_length) return 1;
  return reg1 < reg2 ? -1 : 1; /* make sort stable */
}